

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

double __thiscall
ON_RenderContent::ChildSlotAmount
          (ON_RenderContent *this,wchar_t *child_slot_name,double default_value)

{
  bool bVar1;
  Types TVar2;
  int iVar3;
  wchar_t *pwVar4;
  double dVar5;
  ON_XMLVariant local_250;
  ON_wString local_158;
  ON_wString local_150;
  undefined4 local_144;
  undefined1 local_140 [8];
  ON_XMLVariant v;
  ON_wString local_38;
  ON_wString local_30;
  ON_wString s;
  double default_value_local;
  wchar_t *child_slot_name_local;
  ON_RenderContent *this_local;
  
  s.m_s = (wchar_t *)default_value;
  ON_wString::ON_wString(&local_38,child_slot_name);
  ON_wString::operator+(&local_30,(wchar_t *)&local_38);
  ON_wString::~ON_wString(&local_38);
  pwVar4 = ON_wString::operator_cast_to_wchar_t_(&local_30);
  (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x2d])(local_140,this,pwVar4);
  bVar1 = ::ON_XMLVariant::IsNull((ON_XMLVariant *)local_140);
  if (bVar1) {
    ON_wString::ON_wString(&local_158,child_slot_name);
    ON_wString::operator+(&local_150,(wchar_t *)&local_158);
    ON_wString::operator=(&local_30,&local_150);
    ON_wString::~ON_wString(&local_150);
    ON_wString::~ON_wString(&local_158);
    pwVar4 = ON_wString::operator_cast_to_wchar_t_(&local_30);
    (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x2d])(&local_250,this,pwVar4)
    ;
    ::ON_XMLVariant::operator=((ON_XMLVariant *)local_140,&local_250);
    ::ON_XMLVariant::~ON_XMLVariant(&local_250);
    bVar1 = ::ON_XMLVariant::IsNull((ON_XMLVariant *)local_140);
    if (bVar1) {
      this_local = (ON_RenderContent *)s.m_s;
    }
    else {
      TVar2 = ::ON_XMLVariant::Type((ON_XMLVariant *)local_140);
      if (TVar2 == Integer) {
        iVar3 = ::ON_XMLVariant::AsInteger((ON_XMLVariant *)local_140);
        this_local = (ON_RenderContent *)(double)iVar3;
      }
      else {
        dVar5 = ::ON_XMLVariant::AsDouble((ON_XMLVariant *)local_140);
        this_local = (ON_RenderContent *)(dVar5 * 100.0);
      }
    }
  }
  else {
    dVar5 = ::ON_XMLVariant::AsDouble((ON_XMLVariant *)local_140);
    this_local = (ON_RenderContent *)(dVar5 * 100.0);
  }
  local_144 = 1;
  ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)local_140);
  ON_wString::~ON_wString(&local_30);
  return (double)this_local;
}

Assistant:

double ON_RenderContent::ChildSlotAmount(const wchar_t* child_slot_name, double default_value) const
{
  // This is complicated. See https://mcneel.myjetbrains.com/youtrack/issue/RH-58417

  // Try to get the new double amount value in the range 0..1.
  auto s = ON_wString(child_slot_name) + L"-" MAT_POSTFIX_DOUBLE_AMOUNT;
  auto v = GetParameter(s);
  if (!v.IsNull())
  {
    // Got it, so return it in the range 0..100.
    return v.AsDouble() * 100.0;
  }

  // Couldn't get it so get the legacy amount value. This value is problematic (which is why we added
  // the new double amount). The reason is that originally, the value was supposed to be in the range
  // 0..100, and the Physically Based material is an example of a material that does this. But due to
  // an oversight, the Custom Material saved this in the range 0..1. This means that here, in generic
  // code that doesn't know which class saved the data, we have to figure out what range it's in by
  // looking at the variant's type.
  s = ON_wString(child_slot_name) + L"-" MAT_POSTFIX_AMOUNT;
  v = GetParameter(s);
  if (!v.IsNull())
  {
    if (v.Type() == ON_XMLVariant::Types::Integer)
    {
      // Got it as an integer so it's already in the range 0..100.
      return double(v.AsInteger());
    }
    else
    {
      // The double value is in the range 0..1. Return it in the range 0..100.
      return v.AsDouble() * 100.0;
    }
  }

  return default_value;
}